

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O3

int main(int argc,char **argv)

{
  PFNGLROTATEFPROC p_Var1;
  int iVar2;
  undefined8 in_RAX;
  time_t tVar3;
  GLFWmonitor **ppGVar4;
  GLFWvidmode *pGVar5;
  GLFWwindow *window;
  GLFWmonitor *handle;
  uint uVar6;
  int height;
  double dVar7;
  int monitorCount;
  undefined8 local_38;
  
  local_38 = in_RAX;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
LAB_00110bea:
    exit(1);
  }
  uVar6 = 0;
  do {
    if ((uVar6 & 1) == 0) {
      ppGVar4 = glfwGetMonitors((int *)((long)&local_38 + 4));
      iVar2 = rand();
      handle = ppGVar4[iVar2 % local_38._4_4_];
      if (handle == (GLFWmonitor *)0x0) goto LAB_00110c4d;
      pGVar5 = glfwGetVideoMode(handle);
      iVar2 = pGVar5->width;
      height = pGVar5->height;
    }
    else {
LAB_00110c4d:
      iVar2 = 0x280;
      height = 0x1e0;
      handle = (GLFWmonitor *)0x0;
    }
    window = open_window(iVar2,height,handle);
    if (window == (GLFWwindow *)0x0) {
      glfwTerminate();
      goto LAB_00110bea;
    }
    local_38 = CONCAT44(local_38._4_4_,uVar6);
    (*glad_glMatrixMode)(0x1701);
    (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,1.0,-1.0);
    (*glad_glMatrixMode)(0x1700);
    glfwSetTime(0.0);
    while( true ) {
      dVar7 = glfwGetTime();
      if (5.0 <= dVar7) break;
      (*glad_glClear)(0x4000);
      (*glad_glPushMatrix)();
      p_Var1 = glad_glRotatef;
      dVar7 = glfwGetTime();
      (*p_Var1)((float)dVar7 * 100.0,0.0,0.0,1.0);
      (*glad_glRectf)(-0.5,-0.5,1.0,1.0);
      (*glad_glPopMatrix)();
      glfwSwapBuffers(window);
      glfwPollEvents();
      iVar2 = glfwWindowShouldClose(window);
      if (iVar2 != 0) {
        close_window(window);
        puts("User closed window");
        glfwTerminate();
        exit(0);
      }
    }
    puts("Closing window");
    close_window(window);
    uVar6 = (int)local_38 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;

        if (count % 2 == 0)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        window = open_window(width, height, monitor);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glMatrixMode(GL_PROJECTION);
        glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);

            glPushMatrix();
            glRotatef((GLfloat) glfwGetTime() * 100.f, 0.f, 0.f, 1.f);
            glRectf(-0.5f, -0.5f, 1.f, 1.f);
            glPopMatrix();

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}